

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O3

int BUFFER_enlarge(BUFFER_HANDLE handle,size_t enlargeSize)

{
  uchar *puVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  size_t __size;
  
  if (handle == (BUFFER_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar4 = 0x160;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x160;
    }
    pcVar5 = "Failure: handle is invalid.";
    iVar3 = 0x15f;
  }
  else if (enlargeSize == 0) {
    p_Var2 = xlogging_get_log_function();
    iVar4 = 0x166;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x166;
    }
    pcVar5 = "Failure: enlargeSize size is 0.";
    iVar3 = 0x165;
  }
  else {
    __size = 0xffffffffffffffff;
    if (!CARRY8(handle->size,enlargeSize)) {
      __size = handle->size + enlargeSize;
    }
    if ((__size != 0xffffffffffffffff) &&
       (puVar1 = (uchar *)realloc(handle->buffer,__size), puVar1 != (uchar *)0x0)) {
      handle->buffer = puVar1;
      handle->size = handle->size + enlargeSize;
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar4 = 0x172;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x172;
    }
    pcVar5 = "Failure: allocating temp buffer, size:%zu";
    iVar3 = 0x171;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/buffer.c"
            ,"BUFFER_enlarge",iVar3,1,pcVar5);
  return iVar4;
}

Assistant:

int BUFFER_enlarge(BUFFER_HANDLE handle, size_t enlargeSize)
{
    int result;
    if (handle == NULL)
    {
        /* Codes_SRS_BUFFER_07_017: [BUFFER_enlarge shall return a nonzero result if any parameters are NULL or zero.] */
        LogError("Failure: handle is invalid.");
        result = MU_FAILURE;
    }
    else if (enlargeSize == 0)
    {
        /* Codes_SRS_BUFFER_07_017: [BUFFER_enlarge shall return a nonzero result if any parameters are NULL or zero.] */
        LogError("Failure: enlargeSize size is 0.");
        result = MU_FAILURE;
    }
    else
    {
        unsigned char* temp;
        BUFFER* b = (BUFFER*)handle;
        size_t malloc_size = safe_add_size_t(b->size, enlargeSize);
        if (malloc_size == SIZE_MAX ||
            (temp = (unsigned char*)realloc(b->buffer, malloc_size)) == NULL)
        {
            /* Codes_SRS_BUFFER_07_018: [BUFFER_enlarge shall return a nonzero result if any error is encountered.] */
            LogError("Failure: allocating temp buffer, size:%zu", malloc_size);
            result = MU_FAILURE;
        }
        else
        {
            b->buffer = temp;
            b->size += enlargeSize;
            result = 0;
        }
    }
    return result;
}